

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O2

void __thiscall
CNetAddr::SerializeV2Stream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams> *s)

{
  bool bVar1;
  BIP155Network obj;
  long in_FS_OFFSET;
  size_t *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsInternal(this);
  if (bVar1) {
    ser_writedata8<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(s,'\x02');
    local_20 = &ADDR_IPV6_SIZE;
    Wrapper<CompactSizeFormatter<true>,unsigned_long_const&>::
    Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>
              ((Wrapper<CompactSizeFormatter<true>,unsigned_long_const&> *)&local_20,s);
    SerializeV1Stream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(this,s);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  else {
    obj = GetBIP155Network(this);
    ser_writedata8<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>>(s,obj);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      Serialize<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>,16u,unsigned_char>
                (s,&this->m_addr);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV2Stream(Stream& s) const
    {
        if (IsInternal()) {
            // Serialize NET_INTERNAL as embedded in IPv6. We need to
            // serialize such addresses from addrman.
            s << static_cast<uint8_t>(BIP155Network::IPV6);
            s << COMPACTSIZE(ADDR_IPV6_SIZE);
            SerializeV1Stream(s);
            return;
        }

        s << static_cast<uint8_t>(GetBIP155Network());
        s << m_addr;
    }